

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O2

void rgba_5551_to_bgr_888
               (void *src,int src_pitch,void *dst,int dst_pitch,int sx,int sy,int dx,int dy,
               int width,int height)

{
  undefined1 *puVar1;
  ushort uVar2;
  ushort *puVar3;
  uint uVar4;
  undefined1 *puVar5;
  int iVar6;
  
  puVar3 = (ushort *)((long)src + (long)sx * 2 + (long)(sy * src_pitch));
  puVar5 = (undefined1 *)((long)dst + (long)(dx * 3) + (long)(dy * dst_pitch));
  iVar6 = 0;
  if (height < 1) {
    height = 0;
  }
  for (; iVar6 != height; iVar6 = iVar6 + 1) {
    puVar1 = puVar5 + width * 3;
    for (; puVar5 < puVar1; puVar5 = puVar5 + 3) {
      uVar2 = *puVar3;
      uVar4 = *(int *)((long)_al_rgb_scale_5 + (ulong)(uVar2 & 0x3e) * 2) << 0x10 |
              _al_rgb_scale_5[uVar2 >> 0xb] |
              *(int *)((long)_al_rgb_scale_5 + (ulong)(uVar2 >> 4 & 0x7c)) << 8;
      *puVar5 = (char)_al_rgb_scale_5[uVar2 >> 0xb];
      puVar5[1] = (char)(uVar4 >> 8);
      puVar5[2] = (char)(uVar4 >> 0x10);
      puVar3 = puVar3 + 1;
    }
    puVar3 = puVar3 + ((long)(src_pitch / 2) - (long)width);
    puVar5 = puVar5 + (dst_pitch + width * -3);
  }
  return;
}

Assistant:

static void rgba_5551_to_bgr_888(const void *src, int src_pitch,
   void *dst, int dst_pitch,
   int sx, int sy, int dx, int dy, int width, int height)
{
   int y;
   const uint16_t *src_ptr = (const uint16_t *)((const char *)src + sy * src_pitch);
   uint8_t *dst_ptr = (void *)((char *)dst + dy * dst_pitch);
   int src_gap = src_pitch / 2 - width;
   int dst_gap = dst_pitch / 1 - width * 3;
   src_ptr += sx;
   dst_ptr += dx * 3;
   for (y = 0; y < height; y++) {
      uint8_t *dst_end = dst_ptr + width * 3;
      while (dst_ptr < dst_end) {
         int dst_pixel = ALLEGRO_CONVERT_RGBA_5551_TO_BGR_888(*src_ptr);
         #ifdef ALLEGRO_BIG_ENDIAN
         dst_ptr[0] = dst_pixel >> 16;
         dst_ptr[1] = dst_pixel >> 8;
         dst_ptr[2] = dst_pixel;
         #else
         dst_ptr[0] = dst_pixel;
         dst_ptr[1] = dst_pixel >> 8;
         dst_ptr[2] = dst_pixel >> 16;
         #endif
         src_ptr += 1;
         dst_ptr += 1 * 3;
      }
      src_ptr += src_gap;
      dst_ptr += dst_gap;
   }
}